

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_copy_to_file.cpp
# Opt level: O3

void __thiscall
duckdb::CopyToFunctionLocalState::InitializeAppendState
          (CopyToFunctionLocalState *this,ClientContext *context,PhysicalCopyToFile *op,
          CopyToFunctionGlobalState *gstate)

{
  _Head_base<0UL,_duckdb::HivePartitionedColumnData_*,_false> _Var1;
  _Head_base<0UL,_duckdb::HivePartitionedColumnData_*,_false> _Var2;
  HivePartitionedColumnData *in_RAX;
  PartitionedColumnDataAppendState *this_00;
  pointer this_01;
  type state;
  _Head_base<0UL,_duckdb::HivePartitionedColumnData_*,_false> local_28;
  
  local_28._M_head_impl = in_RAX;
  make_uniq<duckdb::HivePartitionedColumnData,duckdb::ClientContext&,duckdb::vector<duckdb::LogicalType,true>const&,duckdb::vector<unsigned_long,true>const&,duckdb::shared_ptr<duckdb::GlobalHivePartitionState,true>&>
            ((duckdb *)&local_28,context,&op->expected_types,&op->partition_columns,
             &gstate->partition_state);
  _Var2._M_head_impl = local_28._M_head_impl;
  local_28._M_head_impl = (HivePartitionedColumnData *)0x0;
  _Var1._M_head_impl =
       (this->part_buffer).
       super_unique_ptr<duckdb::HivePartitionedColumnData,_std::default_delete<duckdb::HivePartitionedColumnData>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::HivePartitionedColumnData,_std::default_delete<duckdb::HivePartitionedColumnData>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::HivePartitionedColumnData_*,_std::default_delete<duckdb::HivePartitionedColumnData>_>
       .super__Head_base<0UL,_duckdb::HivePartitionedColumnData_*,_false>._M_head_impl;
  (this->part_buffer).
  super_unique_ptr<duckdb::HivePartitionedColumnData,_std::default_delete<duckdb::HivePartitionedColumnData>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::HivePartitionedColumnData,_std::default_delete<duckdb::HivePartitionedColumnData>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::HivePartitionedColumnData_*,_std::default_delete<duckdb::HivePartitionedColumnData>_>
  .super__Head_base<0UL,_duckdb::HivePartitionedColumnData_*,_false>._M_head_impl =
       _Var2._M_head_impl;
  if (_Var1._M_head_impl != (HivePartitionedColumnData *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_PartitionedColumnData + 8))();
    if (local_28._M_head_impl != (HivePartitionedColumnData *)0x0) {
      (**(code **)(*(long *)local_28._M_head_impl + 8))();
    }
  }
  this_00 = (PartitionedColumnDataAppendState *)operator_new(0x160);
  PartitionedColumnDataAppendState::PartitionedColumnDataAppendState(this_00);
  ::std::
  __uniq_ptr_impl<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>_>
  ::reset((__uniq_ptr_impl<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>_>
           *)&this->part_buffer_append_state,this_00);
  this_01 = unique_ptr<duckdb::HivePartitionedColumnData,_std::default_delete<duckdb::HivePartitionedColumnData>,_true>
            ::operator->(&this->part_buffer);
  state = unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>,_true>
          ::operator*(&this->part_buffer_append_state);
  PartitionedColumnData::InitializeAppendState(&this_01->super_PartitionedColumnData,state);
  this->append_count = 0;
  return;
}

Assistant:

void InitializeAppendState(ClientContext &context, const PhysicalCopyToFile &op,
	                           CopyToFunctionGlobalState &gstate) {
		part_buffer = make_uniq<HivePartitionedColumnData>(context, op.expected_types, op.partition_columns,
		                                                   gstate.partition_state);
		part_buffer_append_state = make_uniq<PartitionedColumnDataAppendState>();
		part_buffer->InitializeAppendState(*part_buffer_append_state);
		append_count = 0;
	}